

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

vector<wasm::Type,_std::allocator<wasm::Type>_> * __thiscall
wasm::HeapType::getTypeChildren
          (vector<wasm::Type,_std::allocator<wasm::Type>_> *__return_storage_ptr__,HeapType *this)

{
  size_t *this_00;
  pointer pFVar1;
  HeapTypeKind HVar2;
  Type *pTVar3;
  Struct *pSVar4;
  Type *pTVar5;
  Field *field;
  pointer __x;
  Iterator IVar6;
  initializer_list<wasm::Type> __l;
  Signature local_70;
  value_type local_60;
  Type t;
  undefined1 local_50 [8];
  Iterator __begin4;
  Type tuple;
  
  HVar2 = getKind(this);
  switch(HVar2) {
  case Basic:
  case Cont:
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    break;
  case Func:
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70 = getSignature(this);
    for (t.id = 0; t.id != 0x10; t.id = t.id + 8) {
      __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           *(size_t *)((long)&local_70.params.id + t.id);
      this_00 = &__begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
      __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      local_50 = (undefined1  [8])this_00;
      IVar6 = wasm::Type::end((Type *)this_00);
      for (pTVar5 = (Type *)0x1;
          (long)pTVar5 -
          IVar6.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index != 1 ||
          IVar6.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
          (Type *)this_00; pTVar5 = (Type *)((long)&pTVar5->id + 1)) {
        pTVar3 = wasm::Type::Iterator::operator*((Iterator *)local_50);
        local_60.id = pTVar3->id;
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                  (__return_storage_ptr__,&local_60);
        __begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar5
        ;
      }
    }
    break;
  case Struct:
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar4 = getStruct(this);
    pFVar1 = (pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__x = (pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start; __x != pFVar1; __x = __x + 1) {
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                (__return_storage_ptr__,&__x->type);
    }
    break;
  case Array:
    getArray((HeapType *)&local_70);
    local_50 = (undefined1  [8])local_70.params.id;
    __l._M_len = 1;
    __l._M_array = (iterator)local_50;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              (__return_storage_ptr__,__l,
               (allocator_type *)
               &__begin4.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    break;
  default:
    handle_unreachable("unexpected kind",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x497);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type> HeapType::getTypeChildren() const {
  switch (getKind()) {
    case HeapTypeKind::Basic:
      return {};
    case HeapTypeKind::Func: {
      std::vector<Type> children;
      auto sig = getSignature();
      for (auto tuple : {sig.params, sig.results}) {
        for (auto t : tuple) {
          children.push_back(t);
        }
      }
      return children;
    }
    case HeapTypeKind::Struct: {
      std::vector<Type> children;
      for (auto& field : getStruct().fields) {
        children.push_back(field.type);
      }
      return children;
    }
    case HeapTypeKind::Array:
      return {getArray().element.type};
    case HeapTypeKind::Cont:
      return {};
  }
  WASM_UNREACHABLE("unexpected kind");
}